

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O0

void print_values(sensor *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  sensor *in_RDI;
  float fVar5;
  uint in_stack_0000000c;
  sensor *in_stack_00000010;
  uint i;
  uint m;
  int dp;
  undefined8 in_stack_ffffffffffffffa8;
  sensor *in_stack_ffffffffffffffb0;
  string *psVar6;
  string local_38 [36];
  uint local_14;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = ev3dev::sensor::decimals
                    ((sensor *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  uVar2 = ev3dev::sensor::num_values((sensor *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  for (local_14 = 0; local_14 < uVar2; local_14 = local_14 + 1) {
    if (local_14 != 0) {
      std::operator<<((ostream *)&std::cout,"; ");
    }
    if (iVar1 == 0) {
      iVar3 = ev3dev::sensor::value(in_stack_00000010,in_stack_0000000c);
      std::ostream::operator<<(&std::cout,iVar3);
    }
    else {
      fVar5 = ev3dev::sensor::float_value
                        (in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20))
      ;
      std::ostream::operator<<(&std::cout,fVar5);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  psVar6 = local_38;
  ev3dev::sensor::units_abi_cxx11_(in_RDI);
  std::operator<<(poVar4,psVar6);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void print_values(sensor &s)
{
  auto dp = s.decimals();
  unsigned m = s.num_values();
  for (unsigned i=0; i<m; ++i)
  {
    if (i) cout << "; ";
    if (dp)
      cout << s.float_value(i);
    else
      cout << s.value(i);
  }
  cout << " " << s.units();
}